

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O2

bool __thiscall
cmIfCommand::InvokeInitialPass
          (cmIfCommand *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  bool bVar1;
  cmIfFunctionBlocker *this_00;
  MessageType status;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string err;
  string errorString;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_9c;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_98;
  string local_78;
  string local_58;
  cmConditionEvaluator local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_98.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_98,(char *)0x0);
  cmConditionEvaluator::cmConditionEvaluator(&local_38,(this->super_cmCommand).Makefile);
  bVar1 = cmConditionEvaluator::IsTrue(&local_38,&local_98,&local_58,&local_9c);
  if (local_58._M_string_length != 0) {
    cmIfCommandError_abi_cxx11_(&local_78,&local_98);
    std::__cxx11::string::append((string *)&local_78);
    if (local_9c == FATAL_ERROR) {
      cmCommand::SetError(&this->super_cmCommand,&local_78);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else {
      cmMakefile::IssueMessage((this->super_cmCommand).Makefile,local_9c,&local_78);
    }
    std::__cxx11::string::~string((string *)&local_78);
    if (local_9c == FATAL_ERROR) {
      bVar1 = false;
      goto LAB_003c1573;
    }
  }
  this_00 = (cmIfFunctionBlocker *)operator_new(0x88);
  cmIfFunctionBlocker::cmIfFunctionBlocker(this_00);
  this_00->ScopeDepth = 1;
  this_00->IsBlocking = !bVar1;
  if (bVar1) {
    this_00->HasRun = true;
  }
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            (&this_00->Args,args);
  bVar1 = true;
  cmMakefile::AddFunctionBlocker((this->super_cmCommand).Makefile,(cmFunctionBlocker *)this_00);
LAB_003c1573:
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            (&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

bool cmIfCommand
::InvokeInitialPass(const std::vector<cmListFileArgument>& args,
                    cmExecutionStatus &)
{
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  this->Makefile->ExpandArguments(args, expandedArguments);

  cmake::MessageType status;

  cmConditionEvaluator conditionEvaluator(*(this->Makefile));

  bool isTrue = conditionEvaluator.IsTrue(
    expandedArguments, errorString, status);

  if (!errorString.empty())
    {
    std::string err = cmIfCommandError(expandedArguments);
    err += errorString;
    if (status == cmake::FATAL_ERROR)
      {
      this->SetError(err);
      cmSystemTools::SetFatalErrorOccured();
      return false;
      }
    else
      {
      this->Makefile->IssueMessage(status, err);
      }
    }

  cmIfFunctionBlocker *f = new cmIfFunctionBlocker();
  // if is isn't true block the commands
  f->ScopeDepth = 1;
  f->IsBlocking = !isTrue;
  if (isTrue)
    {
    f->HasRun = true;
    }
  f->Args = args;
  this->Makefile->AddFunctionBlocker(f);

  return true;
}